

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O1

bool __thiscall
ON_OffsetSurfaceFunction::EvaluateDistance
          (ON_OffsetSurfaceFunction *this,double s,double t,int num_der,double *value)

{
  bool bVar1;
  double *value_00;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  double barray [21];
  double local_d8 [21];
  
  iVar3 = (num_der + 2) * (num_der + 1);
  uVar4 = iVar3 / 2;
  if (1 < iVar3) {
    memset(value,0,(ulong)(uVar4 - 1) * 8 + 8);
  }
  bVar1 = Initialize(this);
  if (bVar1) {
    if (iVar3 < 0x2c) {
      value_00 = local_d8;
    }
    else {
      value_00 = (double *)onmalloc((ulong)uVar4 * 8);
    }
    lVar6 = (long)(this->m_bumps).m_count;
    if (0 < lVar6) {
      lVar5 = 0;
      do {
        ON_BumpFunction::Evaluate((this->m_bumps).m_a + lVar5,s,t,num_der,value_00);
        if (1 < iVar3) {
          uVar2 = 0;
          do {
            value[uVar2] = value_00[uVar2] + value[uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar4 != uVar2);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar6);
    }
    if (value_00 != local_d8) {
      onfree(value_00);
    }
  }
  return bVar1;
}

Assistant:

bool ON_OffsetSurfaceFunction::EvaluateDistance(
      double s,
      double t,
      int num_der,
      double* value
      ) const
{
  const int vcnt = ((num_der+1)*(num_der+2))/2;
  for ( int vi = 0; vi < vcnt; vi++ )
  {
    value[vi] = 0;
  }

  bool rc = const_cast<ON_OffsetSurfaceFunction*>(this)->Initialize();

  if (rc)
  {
    double barray[21];
    double* bump_value = (vcnt > 21)
                       ? (double*)onmalloc(vcnt*sizeof(bump_value[0]))
                       : barray;
    const int bump_count = m_bumps.Count();
    int bump_index;
    for ( bump_index = 0; bump_index < bump_count; bump_index++ )
    {
      m_bumps[bump_index].Evaluate( s, t, num_der, bump_value );
      for ( int vi = 0; vi < vcnt; vi++ )
      {
        value[vi] += bump_value[vi];
      }
    }
    if ( bump_value != barray )
      onfree(bump_value);
  }
  return rc;
}